

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix.cpp
# Opt level: O2

Matrix<Finite> __thiscall
Matrix<Finite>::submatrix(Matrix<Finite> *this,uint x1,uint y1,uint x2,uint y2)

{
  uint uVar1;
  uint uVar2;
  ulong uVar3;
  long lVar4;
  long lVar5;
  Finite *extraout_RDX;
  Finite *pFVar6;
  Finite *extraout_RDX_00;
  uint uVar7;
  undefined4 in_register_00000034;
  long lVar8;
  uint in_R9D;
  uint i;
  uint uVar9;
  uint uVar10;
  Matrix<Finite> MVar11;
  
  uVar1 = y2;
  if (y2 < y1) {
    uVar1 = y1;
  }
  uVar3 = (ulong)y2;
  if (y1 < y2) {
    y2 = y1;
  }
  uVar7 = in_R9D;
  if (in_R9D < x2) {
    uVar7 = x2;
  }
  uVar10 = in_R9D;
  if (x2 < in_R9D) {
    uVar10 = x2;
  }
  lVar5 = y1 - uVar3;
  lVar8 = -lVar5;
  if (0 < lVar5) {
    lVar8 = lVar5;
  }
  lVar4 = (ulong)x2 - (ulong)in_R9D;
  lVar5 = -lVar4;
  if (0 < lVar4) {
    lVar5 = lVar4;
  }
  Matrix(this,(int)lVar8 + 1,(int)lVar5 + 1);
  pFVar6 = extraout_RDX;
  for (uVar9 = y2; uVar9 <= uVar1; uVar9 = uVar9 + 1) {
    for (uVar3 = 0; uVar2 = (int)uVar3 + uVar10, uVar2 <= uVar7; uVar3 = (ulong)((int)uVar3 + 1)) {
      BigInteger::operator=
                (&this->arr[this->N * (uVar9 - y2) + uVar3].val,
                 (BigInteger *)
                 ((ulong)uVar2 * 0x20 +
                 (ulong)(*(int *)(CONCAT44(in_register_00000034,x1) + 4) * uVar9) * 0x20 +
                 *(long *)(CONCAT44(in_register_00000034,x1) + 8)));
      pFVar6 = extraout_RDX_00;
    }
  }
  MVar11.arr = pFVar6;
  MVar11._0_8_ = this;
  return MVar11;
}

Assistant:

const Matrix<Field> Matrix<Field>::submatrix(unsigned x1, unsigned y1, unsigned x2, unsigned y2) const
{
    if(x1 > x2)
        std::swap(x1, x2);
    if(y1 > y2)
        std::swap(y1, y2);
    Matrix res(x2 - x1 + 1, y2 - y1 + 1);
    for(unsigned i = x1; i <= x2; ++i)
    {
        for(unsigned j = y1; j <= y2; ++j)
        {
            res[i - x1][j - y1] = (*this)[i][j];
        }
    }
    return res;
}